

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

Float __thiscall
PiecewiseConstant1D_Range_Test::TestBody::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,Float x)

{
  Float x_local;
  anon_class_1_0_00000001 *this_local;
  
  return x + 1.0;
}

Assistant:

TEST(PiecewiseConstant1D, Range) {
    auto values = Sample1DFunction([](Float x) { return 1 + x; }, 65536, 4, -1.f, 3.f);
    PiecewiseConstant1D dist(values, -1.f, 3.f);
    // p(x) = (1+x) / 8
    // xi = int_{-1}^x p(x) ->
    // xi = 1/16 x^2 + x/8 + 1/16 ->
    // Solve 0 = 1/16 x^2 + x/8 + 1/16 - xi to sample

    for (Float u : Uniform1D(100)) {
        Float pd;
        Float xd = dist.Sample(u, &pd);

        Float t0, t1;
        ASSERT_TRUE(Quadratic(1. / 16., 1. / 8., 1. / 16 - u, &t0, &t1));
        Float xa = (t0 >= -1 && t0 <= 3) ? t0 : t1;
        Float pa = (1 + xa) / 8;

        EXPECT_LT(std::abs(xd - xa) / xa, 2e-3) << xd << " vs " << xa;
        EXPECT_LT(std::abs(pd - pa) / pa, 2e-3) << pd << " vs " << pa;
    }
}